

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_imply_from(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_DBL *total_node_volume_00;
  double local_178;
  double local_168;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT nodes [27];
  REF_CELL ref_cell;
  int local_98;
  REF_INT cell;
  REF_INT im;
  REF_INT node;
  REF_DBL *total_node_volume;
  REF_DBL log_m [6];
  REF_DBL m [6];
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x634,
           "ref_metric_imply_from","malloc total_node_volume of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    total_node_volume_00 = (REF_DBL *)malloc((long)ref_node_00->max << 3);
    if (total_node_volume_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x634,"ref_metric_imply_from","malloc total_node_volume of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        total_node_volume_00[ref_private_macro_code_rss_1] = 0.0;
      }
      for (cell = 0; cell < ref_node_00->max; cell = cell + 1) {
        for (local_98 = 0; local_98 < 6; local_98 = local_98 + 1) {
          metric[local_98 + cell * 6] = 0.0;
        }
      }
      if (ref_grid->twod != 0) {
        unique0x00012000 = ref_grid->cell[3];
        for (ref_cell._4_4_ = 0; ref_cell._4_4_ < stack0xffffffffffffff58->max;
            ref_cell._4_4_ = ref_cell._4_4_ + 1) {
          RVar1 = ref_cell_nodes(stack0xffffffffffffff58,ref_cell._4_4_,&ref_private_macro_code_rss)
          ;
          if ((RVar1 == 0) &&
             (uVar2 = add_sub_tri(0,1,2,&ref_private_macro_code_rss,metric,total_node_volume_00,
                                  ref_node_00,stack0xffffffffffffff58), uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x63e,"ref_metric_imply_from",(ulong)uVar2,"tet sub tet");
            return uVar2;
          }
        }
      }
      unique0x00012000 = ref_grid->cell[8];
      for (ref_cell._4_4_ = 0; ref_cell._4_4_ < stack0xffffffffffffff58->max;
          ref_cell._4_4_ = ref_cell._4_4_ + 1) {
        RVar1 = ref_cell_nodes(stack0xffffffffffffff58,ref_cell._4_4_,&ref_private_macro_code_rss);
        if ((RVar1 == 0) &&
           (uVar2 = add_sub_tet(0,1,2,3,&ref_private_macro_code_rss,metric,total_node_volume_00,
                                ref_node_00,stack0xffffffffffffff58), uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x646,"ref_metric_imply_from",(ulong)uVar2,"tet sub tet");
          return uVar2;
        }
      }
      unique0x00012000 = ref_grid->cell[10];
      for (ref_cell._4_4_ = 0; ref_cell._4_4_ < stack0xffffffffffffff58->max;
          ref_cell._4_4_ = ref_cell._4_4_ + 1) {
        RVar1 = ref_cell_nodes(stack0xffffffffffffff58,ref_cell._4_4_,&ref_private_macro_code_rss);
        if (RVar1 == 0) {
          uVar2 = add_sub_tet(0,4,5,3,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x64d,"ref_metric_imply_from",(ulong)uVar2,"pri sub tet");
            return uVar2;
          }
          uVar2 = add_sub_tet(0,1,5,4,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x650,"ref_metric_imply_from",(ulong)uVar2,"pri sub tet");
            return uVar2;
          }
          uVar2 = add_sub_tet(0,1,2,5,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x653,"ref_metric_imply_from",(ulong)uVar2,"pri sub tet");
            return uVar2;
          }
        }
      }
      unique0x00012000 = ref_grid->cell[9];
      for (ref_cell._4_4_ = 0; ref_cell._4_4_ < stack0xffffffffffffff58->max;
          ref_cell._4_4_ = ref_cell._4_4_ + 1) {
        RVar1 = ref_cell_nodes(stack0xffffffffffffff58,ref_cell._4_4_,&ref_private_macro_code_rss);
        if (RVar1 == 0) {
          uVar2 = add_sub_tet(0,4,1,2,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x65a,"ref_metric_imply_from",(ulong)uVar2,"pyr sub tet");
            return uVar2;
          }
          uVar2 = add_sub_tet(0,3,4,2,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x65d,"ref_metric_imply_from",(ulong)uVar2,"pyr sub tet");
            return uVar2;
          }
        }
      }
      unique0x00012000 = ref_grid->cell[0xb];
      for (ref_cell._4_4_ = 0; ref_cell._4_4_ < stack0xffffffffffffff58->max;
          ref_cell._4_4_ = ref_cell._4_4_ + 1) {
        RVar1 = ref_cell_nodes(stack0xffffffffffffff58,ref_cell._4_4_,&ref_private_macro_code_rss);
        if (RVar1 == 0) {
          uVar2 = add_sub_tet(0,5,7,4,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x664,"ref_metric_imply_from",(ulong)uVar2,"hex sub tet");
            return uVar2;
          }
          uVar2 = add_sub_tet(0,1,7,5,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x667,"ref_metric_imply_from",(ulong)uVar2,"hex sub tet");
            return uVar2;
          }
          uVar2 = add_sub_tet(1,6,7,5,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x66a,"ref_metric_imply_from",(ulong)uVar2,"hex sub tet");
            return uVar2;
          }
          uVar2 = add_sub_tet(0,7,2,3,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x66e,"ref_metric_imply_from",(ulong)uVar2,"hex sub tet");
            return uVar2;
          }
          uVar2 = add_sub_tet(0,7,1,2,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x671,"ref_metric_imply_from",(ulong)uVar2,"hex sub tet");
            return uVar2;
          }
          uVar2 = add_sub_tet(1,7,6,2,&ref_private_macro_code_rss,metric,total_node_volume_00,
                              ref_node_00,stack0xffffffffffffff58);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x674,"ref_metric_imply_from",(ulong)uVar2,"hex sub tet");
            return uVar2;
          }
        }
      }
      for (cell = 0; cell < ref_node_00->max; cell = cell + 1) {
        if ((((-1 < cell) && (cell < ref_node_00->max)) && (-1 < ref_node_00->global[cell])) &&
           (ref_node_00->ref_mpi->id == ref_node_00->part[cell])) {
          if (total_node_volume_00[cell] <= 0.0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x679,"ref_metric_imply_from","zero metric contributions");
            return 1;
          }
          for (local_98 = 0; local_98 < 6; local_98 = local_98 + 1) {
            if (total_node_volume_00[cell] * 1e+20 <= 0.0) {
              local_168 = -(total_node_volume_00[cell] * 1e+20);
            }
            else {
              local_168 = total_node_volume_00[cell] * 1e+20;
            }
            if (metric[local_98 + cell * 6] <= 0.0) {
              local_178 = -metric[local_98 + cell * 6];
            }
            else {
              local_178 = metric[local_98 + cell * 6];
            }
            if (local_168 <= local_178) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x67c,"ref_metric_imply_from",4,"zero volume");
              return 4;
            }
            log_m[(long)local_98 + -1] = metric[local_98 + cell * 6] / total_node_volume_00[cell];
          }
          uVar2 = ref_matrix_exp_m((REF_DBL *)&total_node_volume,log_m + 5);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x67f,"ref_metric_imply_from",(ulong)uVar2,"exp");
            return uVar2;
          }
          for (local_98 = 0; local_98 < 6; local_98 = local_98 + 1) {
            metric[local_98 + cell * 6] = log_m[(long)local_98 + 5];
          }
          total_node_volume_00[cell] = 0.0;
        }
      }
      if (total_node_volume_00 != (REF_DBL *)0x0) {
        free(total_node_volume_00);
      }
      metric_local._4_4_ = ref_node_ghost_dbl(ref_node_00,metric,6);
      if (metric_local._4_4_ == 0) {
        metric_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x687,"ref_metric_imply_from",(ulong)metric_local._4_4_,"update ghosts");
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_imply_from(REF_DBL *metric, REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL m[6], log_m[6];
  REF_DBL *total_node_volume;
  REF_INT node, im;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_malloc_init(total_node_volume, ref_node_max(ref_node), REF_DBL, 0.0);

  for (node = 0; node < ref_node_max(ref_node); node++)
    for (im = 0; im < 6; im++) metric[im + 6 * node] = 0.0;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(add_sub_tri(0, 1, 2, nodes, metric, total_node_volume, ref_node,
                      ref_cell),
          "tet sub tet");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 1, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "tet sub tet");
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 5, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 5, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 2, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
    RSS(add_sub_tet(0, 3, 4, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
  }

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 5, 7, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 1, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 6, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");

    RSS(add_sub_tet(0, 7, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 7, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 7, 6, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RAS(0.0 < total_node_volume[node], "zero metric contributions");
      for (im = 0; im < 6; im++) {
        if (!ref_math_divisible(metric[im + 6 * node], total_node_volume[node]))
          RSS(REF_DIV_ZERO, "zero volume");
        log_m[im] = metric[im + 6 * node] / total_node_volume[node];
      }
      RSS(ref_matrix_exp_m(log_m, m), "exp");
      for (im = 0; im < 6; im++) metric[im + 6 * node] = m[im];
      total_node_volume[node] = 0.0;
    }
  }

  ref_free(total_node_volume);

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}